

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm-start.h
# Opt level: O0

bool __thiscall WarmStartBrancher::finished(WarmStartBrancher *this)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  Lit *pLVar4;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  lbool in_stack_ffffffffffffffdf;
  Lit in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  lbool in_stack_ffffffffffffffe6;
  lbool lVar5;
  lbool local_11 [17];
  
  if ((engine.conflicts <= *(int *)(in_RDI + 0x20)) &&
     (iVar1 = *(int *)(in_RDI + 0x18), uVar3 = vec<Lit>::size((vec<Lit> *)(in_RDI + 8)),
     iVar1 < (int)uVar3)) {
    vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 8),*(uint *)(in_RDI + 0x18));
    local_11[0] = SAT::value((SAT *)CONCAT17(in_stack_ffffffffffffffdf.value,
                                             in_stack_ffffffffffffffd8),in_stack_ffffffffffffffe0);
    lVar5 = ::l_Undef;
    bVar2 = lbool::operator==(local_11,::l_Undef);
    if (bVar2) {
      return false;
    }
    if (engine.conflicts < *(int *)(in_RDI + 0x20)) {
      trailSave<int>((int *)CONCAT17(lVar5.value,
                                     CONCAT16(in_stack_ffffffffffffffe6.value,
                                              CONCAT24(in_stack_ffffffffffffffe4,
                                                       in_stack_ffffffffffffffe0.x))));
    }
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
    while (iVar1 = *(int *)(in_RDI + 0x18), uVar3 = vec<Lit>::size((vec<Lit> *)(in_RDI + 8)),
          iVar1 < (int)uVar3) {
      pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 8),*(uint *)(in_RDI + 0x18));
      SAT::value((SAT *)CONCAT17(in_stack_ffffffffffffffdf.value,in_stack_ffffffffffffffd8),
                 (Lit)pLVar4->x);
      in_stack_ffffffffffffffdf = ::l_Undef;
      bVar2 = lbool::operator==((lbool *)&stack0xffffffffffffffe6,::l_Undef);
      if (bVar2) {
        return false;
      }
      *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
    }
  }
  return true;
}

Assistant:

bool finished() override {
		// Already deactivated
		if (engine.conflicts > init_conflicts) {
			return true;
		}

		if (pos < static_cast<int>(decs.size())) {
			if (sat.value(decs[pos]) == l_Undef) {
				return false;
			}
			if (engine.conflicts < init_conflicts) {
				trailSave(pos);
			}
			for (++pos; pos < static_cast<int>(decs.size()); ++pos) {
				if (sat.value(decs[pos]) == l_Undef) {
					return false;
				}
			}
		}
		return true;
	}